

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int pager_fill_page(Pager *pPager,pgno iNum,void *pContents)

{
  Page *pPVar1;
  Page *pPage;
  void *pContents_local;
  pgno iNum_local;
  Pager *pPager_local;
  
  pPVar1 = pager_fetch_page(pPager,iNum);
  if (pPVar1 == (Page *)0x0) {
    pPager_local._4_4_ = -6;
  }
  else {
    SyMemcpy(pContents,pPVar1->zData,pPager->iPageSize);
    pPager_local._4_4_ = 0;
  }
  return pPager_local._4_4_;
}

Assistant:

static int pager_fill_page(Pager *pPager,pgno iNum,void *pContents)
{
	Page *pPage;
	/* Fetch the page from the catch */
	pPage = pager_fetch_page(pPager,iNum);
	if( pPage == 0 ){
		return SXERR_NOTFOUND;
	}
	/* Reflect the change */
	SyMemcpy(pContents,pPage->zData,pPager->iPageSize);

	return UNQLITE_OK;
}